

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkNodeSupport(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Abc_Obj_t *pNode;
  ulong uVar3;
  int iVar4;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar1 = pNtk->vObjs->nSize;
    uVar3 = (long)iVar1 + 500;
    iVar4 = (int)uVar3;
    if ((pNtk->vTravIds).nCap < iVar4) {
      __s = (int *)malloc(uVar3 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar4;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(__s,0,(uVar3 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar4;
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (iVar1 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar2 = (void **)malloc(800);
    vNodes->pArray = ppvVar2;
    if (0 < nNodes) {
      uVar3 = 0;
      do {
        pNode = ppNodes[uVar3];
        if (0xfffffffd < (*(uint *)&pNode->field_0x14 & 0xf) - 5) {
          pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        }
        Abc_NtkNodeSupport_rec(pNode,vNodes);
        uVar3 = uVar3 + 1;
      } while ((uint)nNodes != uVar3);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkNodeSupport( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    for ( i = 0; i < nNodes; i++ )
        if ( Abc_ObjIsCo(ppNodes[i]) )
            Abc_NtkNodeSupport_rec( Abc_ObjFanin0(ppNodes[i]), vNodes );
        else
            Abc_NtkNodeSupport_rec( ppNodes[i], vNodes );
    return vNodes;
}